

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta.h
# Opt level: O3

int __thiscall mpt::metatype::value<int>::convert(value<int> *this,type_t type,void *dest)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  int *local_10;
  undefined8 local_8;
  
  if (type == 0) {
    mpt::metatype::convert((ulong)this,(void *)0x0);
    return 0x69;
  }
  if (pointer_traits(bool)::traits == 0) {
    uVar3 = 0xfffffffd;
  }
  else {
    uVar3 = *(uint *)(pointer_traits(bool)::traits + 0x10);
  }
  if (type == 0x100) {
    if (dest != (void *)0x0) {
      *(value<int> **)dest = this;
    }
  }
  else {
    if (uVar3 == type && 0 < (int)uVar3) {
      if (dest == (void *)0x0) {
        return 0x69;
      }
      *(value<int> **)dest = this;
      return 0x69;
    }
    if (type != 0x69) {
      local_10 = &this->_val;
      local_8 = 0x69;
      iVar2 = mpt::value::convert((ulong)&local_10,(void *)type);
      return iVar2;
    }
    if (dest != (void *)0x0) {
      *(int *)dest = this->_val;
    }
  }
  uVar1 = 0x100;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  return uVar1;
}

Assistant:

int convert(type_t type, void *dest) __MPT_OVERRIDE
	{
		int type_val = type_properties<T>::id(true);
		if (!type) {
			int ret = metatype::convert(0, dest);
			return type_val > 0 ? type_val : ret;
		}
		int type_meta = type_properties<value<T> *>::id(false);
		if (type == TypeMetaPtr) {
			if (dest) {
				*static_cast<metatype **>(dest) = this;
			}
			return type_meta > 0 ? type_meta : static_cast<int>(TypeMetaPtr);
		}
		if (type_meta > 0 && type == static_cast<type_t>(type_meta)) {
			if (dest) {
				*static_cast<metatype **>(dest) = this;
			}
			return type_val > 0 ? type_val : static_cast<int>(TypeMetaPtr);
		}
		if (type_val > 0) {
			if (type == static_cast<type_t>(type_val)) {
				if (dest) {
					*static_cast<T *>(dest) = _val;
				}
				return type_meta > 0 ? type_meta : static_cast<int>(TypeMetaPtr);
			}
			::mpt::value val;
			if (!val.set(type_val, &_val)) {
				return BadType;
			}
			return val.convert(type, dest);
		}
		return BadType;
	}